

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_length<char16_t,char32_t>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  char16_t cVar1;
  char32_t *pcVar2;
  size_t sVar3;
  char16_t *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char32_t cVar7;
  long lVar8;
  
  pcVar4 = in_string._M_str;
  sVar5 = in_string._M_len;
  pcVar2 = in_prefix._M_str;
  sVar3 = in_prefix._M_len;
  sVar6 = 0;
  while( true ) {
    if ((sVar5 == 0) || (sVar3 == 0)) {
      sVar5 = 0;
      if (sVar3 == 0) {
        sVar5 = sVar6;
      }
      return sVar5;
    }
    cVar1 = *pcVar4;
    cVar7 = (char32_t)(ushort)cVar1;
    lVar8 = 1;
    if ((sVar5 != 1) && (((cVar1 & 0xfc00U) == 0xd800 && ((pcVar4[1] & 0xfc00U) == 0xdc00)))) {
      cVar7 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar4[1] + L'\xfca02400';
      lVar8 = 2;
    }
    if (cVar7 != *pcVar2) break;
    pcVar4 = pcVar4 + lVar8;
    sVar5 = sVar5 - lVar8;
    pcVar2 = pcVar2 + 1;
    sVar3 = sVar3 - 1;
    sVar6 = sVar6 + lVar8;
  }
  return 0;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}